

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcpLightCfg.c
# Opt level: O1

void XcpLightCfg_writeToAddress(uint8_t *dest,uint8_t length,uint8_t *data)

{
  long lVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,length) != 0 && dest != (uint8_t *)0x0) {
    lVar1 = 0;
    do {
      dest[lVar1] = data[lVar1];
      lVar1 = lVar1 + 1;
    } while (length != (uint8_t)lVar1);
  }
  return;
}

Assistant:

void XcpLightCfg_writeToAddress(uint8_t *dest, uint8_t length, uint8_t * data)
{
  if (dest != NULL)
  {
    while (length)
    {
      *dest = (*data);
      data++;
      dest++;
      length--;
    }
  }
}